

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapNonFilterable::deinit
          (TextureCubeMapArrayGenerateMipMapNonFilterable *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pSVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  long lVar3;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0xb8))(0x9009,0);
  (**(code **)(lVar3 + 0xff0))(0xd05,4);
  (**(code **)(lVar3 + 0xff0))(0xcf5,4);
  pSVar4 = (this->m_non_filterable_texture_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      if (pSVar4[uVar5].m_to_id != 0) {
        (**(code **)(lVar3 + 0x480))(1,&pSVar4[uVar5].m_to_id);
        (this->m_non_filterable_texture_configs).
        super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5].m_to_id = 0;
      }
      pSVar4 = (this->m_non_filterable_texture_configs).
               super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->m_non_filterable_texture_configs).
                     super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 2) *
              -0x3333333333333333;
      bVar7 = uVar6 <= uVar5;
      lVar1 = uVar5 - uVar6;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar7 && lVar1 != 0);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapNonFilterable::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Restore default bindings */
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

	/* Restore default pixel pack/unpack settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);

	/* Delete all textures the test may have created. */
	for (unsigned int n_storage_config = 0; n_storage_config < m_non_filterable_texture_configs.size();
		 ++n_storage_config)
	{
		if (m_non_filterable_texture_configs[n_storage_config].m_to_id != 0)
		{
			gl.deleteTextures(1, &m_non_filterable_texture_configs[n_storage_config].m_to_id);

			m_non_filterable_texture_configs[n_storage_config].m_to_id = 0;
		}
	}

	/* Call base class' deinit() implementation */
	TestCaseBase::deinit();
}